

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O1

void __thiscall
ktx::
Combine<ktx::CommandExtract::OptionsExtract,_ktx::OptionsTranscodeTarget<false>,_ktx::OptionsSingleIn,_ktx::OptionsGeneric>
::~Combine(Combine<ktx::CommandExtract::OptionsExtract,_ktx::OptionsTranscodeTarget<false>,_ktx::OptionsSingleIn,_ktx::OptionsGeneric>
           *this)

{
  pointer pcVar1;
  pointer pHVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pcVar1 = (this->super_OptionsSingleIn).inputFilepath._M_dataplus._M_p;
  paVar3 = &(this->super_OptionsSingleIn).inputFilepath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_OptionsTranscodeTarget<false>).transcodeSwizzle._M_dataplus._M_p;
  paVar3 = &(this->super_OptionsTranscodeTarget<false>).transcodeSwizzle.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_OptionsTranscodeTarget<false>).transcodeTargetName._M_dataplus._M_p;
  paVar3 = &(this->super_OptionsTranscodeTarget<false>).transcodeTargetName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  pHVar2 = (this->super_OptionsExtract).depth.ranges.
           super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pHVar2 != (pointer)0x0) {
    operator_delete(pHVar2,(long)(this->super_OptionsExtract).depth.ranges.
                                 super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pHVar2);
  }
  pHVar2 = (this->super_OptionsExtract).fragmentURI.facial.ranges.
           super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pHVar2 != (pointer)0x0) {
    operator_delete(pHVar2,(long)*(pointer *)
                                  ((long)&(this->super_OptionsExtract).fragmentURI.facial.ranges.
                                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pHVar2);
  }
  pHVar2 = (this->super_OptionsExtract).fragmentURI.stratal.ranges.
           super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pHVar2 != (pointer)0x0) {
    operator_delete(pHVar2,(long)*(pointer *)
                                  ((long)&(this->super_OptionsExtract).fragmentURI.stratal.ranges.
                                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pHVar2);
  }
  pHVar2 = (this->super_OptionsExtract).fragmentURI.mip.ranges.
           super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pHVar2 != (pointer)0x0) {
    operator_delete(pHVar2,(long)*(pointer *)
                                  ((long)&(this->super_OptionsExtract).fragmentURI.mip.ranges.
                                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pHVar2);
  }
  pcVar1 = (this->super_OptionsExtract).outputPath._M_dataplus._M_p;
  paVar3 = &(this->super_OptionsExtract).outputPath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

void init(cxxopts::Options& opts) {
        (Args::init(opts), ...);
    }